

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask25_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x18140c08));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x3000e07));
  *out = uVar1 << 0x19 | *in;
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar5 = vpshufd_avx(auVar7,0xa0);
  auVar5 = vpinsrd_avx(auVar5,uVar1,0);
  auVar2 = vpinsrd_avx(auVar5,in[4] << 4,2);
  auVar3 = vpinsrd_avx(auVar4,auVar7._4_4_ >> 0x15,2);
  auVar6 = vpsrlvd_avx2(auVar5,auVar4);
  auVar4 = vpsllvd_avx2(auVar7,_DAT_001a40f0);
  uVar1 = in[7];
  auVar5 = vpor_avx(auVar2,auVar3);
  auVar5 = vpblendd_avx2(auVar6,auVar5,4);
  auVar5 = vpor_avx(auVar4,auVar5);
  *(undefined1 (*) [16])(out + 1) = auVar5;
  out[5] = uVar1 << 0xf | auVar7._12_4_ >> 10;
  out[6] = uVar1 >> 0x11;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask25_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (25 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (25 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (25 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (25 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (25 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (25 - 8);
  ++in;

  return out + 1;
}